

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O3

void __thiscall slang::ast::ClassType::computeSize(ClassType *this)

{
  Scope *this_00;
  byte bVar1;
  byte bVar2;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> sVar3;
  Type *this_01;
  uint64_t uVar4;
  ulong uVar5;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>,_(std::ranges::subrange_kind)0>
  sVar6;
  ASTContext local_68;
  
  this_00 = &this->super_Scope;
  if ((this->super_Scope).deferredMemberIndex != Invalid) {
    Scope::elaborate(this_00);
  }
  if ((this->cachedBitstreamWidth).super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged == false) {
    (this->cachedBitstreamWidth).super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = true;
  }
  (this->cachedBitstreamWidth).super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = 0;
  if (this->isInterface == false) {
    local_68.lookupIndex = this->headerIndex;
    local_68.flags.m_bits = 0;
    local_68.instanceOrProc = (Symbol *)0x0;
    local_68.firstTempVar = (TempVarSymbol *)0x0;
    local_68.randomizeDetails = (RandomizeDetails *)0x0;
    local_68.assertionInstance = (AssertionInstanceDetails *)0x0;
    local_68.scope.ptr = this_00;
    sVar6 = Scope::membersOfType<slang::ast::ClassPropertySymbol>(this_00);
    sVar3 = sVar6._M_begin.current;
    if (sVar3.current == sVar6._M_end.current.current) {
      uVar5 = 0;
    }
    else {
      uVar5 = 0;
      bVar2 = 0;
      do {
        bVar1 = bVar2;
        this_01 = DeclaredType::getType((DeclaredType *)(sVar3.current + 1));
        uVar4 = Type::getBitstreamWidth(this_01);
        uVar5 = uVar5 + uVar4;
        if (0x3fffffff8 < uVar5) {
          ASTContext::addDiag(&local_68,(DiagCode)0x180009,(this->super_Type).super_Symbol.location)
          ;
          return;
        }
        do {
          sVar3.current = (sVar3.current)->nextInScope;
          if (sVar3.current == (Symbol *)0x0) {
            sVar3.current = (Symbol *)0x0;
            break;
          }
        } while ((sVar3.current)->kind != ClassProperty);
        bVar2 = bVar1 | uVar4 == 0;
      } while (sVar3.current != sVar6._M_end.current.current);
      if ((bool)(bVar1 | uVar4 == 0)) {
        return;
      }
    }
    (this->cachedBitstreamWidth).super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value = uVar5;
    (this->cachedBitstreamWidth).super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_engaged = true;
  }
  return;
}

Assistant:

void ClassType::computeSize() const {
    ensureElaborated();
    cachedBitstreamWidth = 0;
    if (isInterface)
        return;

    ASTContext context(*this, LookupLocation(this, uint32_t(headerIndex)));

    // Note: no worry of class cycles here because we set cachedBitstreamWidth
    // to zero up above, which will avoid re-entering this function.
    uint64_t totalWidth = 0;
    bool hasDynamic = false;
    for (auto& prop : membersOfType<ClassPropertySymbol>()) {
        uint64_t width = prop.getType().getBitstreamWidth();
        if (width == 0)
            hasDynamic = true;

        totalWidth += width;
        if (totalWidth > MaxBitWidth) {
            context.addDiag(diag::ObjectTooLarge, location);
            return;
        }
    }

    if (!hasDynamic)
        cachedBitstreamWidth = totalWidth;
}